

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O1

_Bool xdr_opaque_auth_encode(XDR *xdrs,opaque_auth *oa)

{
  uint *puVar1;
  uint uVar2;
  _Bool _Var3;
  uint in_EAX;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_28;
  
  uVar2 = oa->oa_flavor;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  uStack_28._0_4_ = in_EAX;
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR oa_flavor";
      pcVar5 = "xdr_opaque_auth_encode";
      uVar4 = 0x55;
      goto LAB_00124397;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  uVar2 = oa->oa_length;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR oa_length";
      pcVar5 = "xdr_opaque_auth_encode";
      uVar4 = 0x5b;
      goto LAB_00124397;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  uVar2 = oa->oa_length;
  if (uVar2 == 0) {
    return true;
  }
  if (uVar2 < 0x191) {
    _Var3 = (*xdrs->x_ops->x_putbytes)(xdrs,oa->oa_body,uVar2);
    if (_Var3) {
      if ((uVar2 & 3) == 0) {
        return true;
      }
      uStack_28 = (ulong)(uint)uStack_28;
      _Var3 = (*xdrs->x_ops->x_putbytes)(xdrs,(char *)((long)&uStack_28 + 4),4 - (uVar2 & 3));
      if (_Var3) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR zero","xdr_opaque_encode",0x1f8);
      }
      if (_Var3) {
        return true;
      }
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar6 = "%s:%u ERROR opaque";
      pcVar5 = "xdr_opaque_encode";
      uVar4 = 0x1e8;
LAB_00124397:
      (*__ntirpc_pkg_params.warnx_)(pcVar6,pcVar5,uVar4);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_encode_it",0x3f,(ulong)uVar2,400);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_auth_encode(XDR *xdrs, struct opaque_auth *oa)
{
	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!xdr_putenum(xdrs, oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	}
	if (!xdr_putuint32(xdrs, oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return (xdr_opaque_auth_encode_it(xdrs, oa));
	}
	return (true);	/* 0 length succeeds */
}